

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

int enet_protocol_handle_throttle_configure(ENetHost *host,ENetPeer *peer,ENetProtocol *command)

{
  uint32_t uVar1;
  long in_RDX;
  long in_RSI;
  undefined4 local_4;
  
  if ((*(int *)(in_RSI + 0x38) == 5) || (*(int *)(in_RSI + 0x38) == 6)) {
    uVar1 = ntohl(*(uint32_t *)(in_RDX + 4));
    *(uint32_t *)(in_RSI + 0xa4) = uVar1;
    uVar1 = ntohl(*(uint32_t *)(in_RDX + 8));
    *(uint32_t *)(in_RSI + 0x9c) = uVar1;
    uVar1 = ntohl(*(uint32_t *)(in_RDX + 0xc));
    *(uint32_t *)(in_RSI + 0xa0) = uVar1;
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int
enet_protocol_handle_throttle_configure (ENetHost * host, ENetPeer * peer, const ENetProtocol * command)
{
    if (peer -> state != ENET_PEER_STATE_CONNECTED && peer -> state != ENET_PEER_STATE_DISCONNECT_LATER)
      return -1;

    peer -> packetThrottleInterval = ENET_NET_TO_HOST_32 (command -> throttleConfigure.packetThrottleInterval);
    peer -> packetThrottleAcceleration = ENET_NET_TO_HOST_32 (command -> throttleConfigure.packetThrottleAcceleration);
    peer -> packetThrottleDeceleration = ENET_NET_TO_HOST_32 (command -> throttleConfigure.packetThrottleDeceleration);

    return 0;
}